

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::parallel_hash_set<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul>
          (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
           *this,size_t *p)

{
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)this,*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0x30),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0x60),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0x90),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0xc0),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0xf0),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0x120),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0x150),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0x180),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0x1b0),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0x1e0),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0x210),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0x240),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0x270),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0x2a0),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0x2d0),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  return;
}

Assistant:

parallel_hash_set(typename Inner::Params const &p,
                      phmap::index_sequence<i...>) : sets_{((void)i, p)...}
    {}